

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_wav__seek_from_start(ma_dr_wav_seek_proc onSeek,ma_uint64 offset,void *pUserData)

{
  int iVar1;
  undefined8 in_RDX;
  ulong in_RSI;
  code *in_RDI;
  ulong local_18;
  ma_bool32 local_4;
  
  if (in_RSI < 0x80000000) {
    local_4 = (*in_RDI)(in_RDX,in_RSI & 0xffffffff,0);
  }
  else {
    iVar1 = (*in_RDI)(in_RDX,0x7fffffff,0);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      for (local_18 = in_RSI - 0x7fffffff; 0x7fffffff < local_18; local_18 = local_18 - 0x7fffffff)
      {
        iVar1 = (*in_RDI)(in_RDX,0x7fffffff,1);
        if (iVar1 == 0) {
          return 0;
        }
      }
      local_4 = (*in_RDI)(in_RDX,local_18 & 0xffffffff,1);
    }
  }
  return local_4;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav__seek_from_start(ma_dr_wav_seek_proc onSeek, ma_uint64 offset, void* pUserData)
{
    if (offset <= 0x7FFFFFFF) {
        return onSeek(pUserData, (int)offset, ma_dr_wav_seek_origin_start);
    }
    if (!onSeek(pUserData, 0x7FFFFFFF, ma_dr_wav_seek_origin_start)) {
        return MA_FALSE;
    }
    offset -= 0x7FFFFFFF;
    for (;;) {
        if (offset <= 0x7FFFFFFF) {
            return onSeek(pUserData, (int)offset, ma_dr_wav_seek_origin_current);
        }
        if (!onSeek(pUserData, 0x7FFFFFFF, ma_dr_wav_seek_origin_current)) {
            return MA_FALSE;
        }
        offset -= 0x7FFFFFFF;
    }
}